

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O1

void __thiscall RegionChecker::RegionChecker(RegionChecker *this,istream *file)

{
  uint uVar1;
  long *plVar2;
  bool bVar3;
  allocator_type local_4a;
  bool local_49;
  vector<bool,_std::allocator<bool>_> local_48;
  
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  std::istream::seekg((long)file,_S_beg);
  plVar2 = *(long **)(file + *(long *)(*(long *)file + -0x18) + 0xe8);
  while( true ) {
    if (plVar2 == (long *)0x0) {
      bVar3 = false;
    }
    else {
      if ((byte *)plVar2[2] < (byte *)plVar2[3]) {
        uVar1 = (uint)*(byte *)plVar2[2];
      }
      else {
        uVar1 = (**(code **)(*plVar2 + 0x48))(plVar2);
      }
      bVar3 = uVar1 != 0xffffffff;
      if (!bVar3) {
        plVar2 = (long *)0x0;
      }
    }
    if (!bVar3) break;
    if (plVar2 == (long *)0x0) {
      bVar3 = true;
    }
    else {
      if ((byte *)plVar2[2] < (byte *)plVar2[3]) {
        uVar1 = (uint)*(byte *)plVar2[2];
      }
      else {
        uVar1 = (**(code **)(*plVar2 + 0x48))(plVar2);
      }
      if (uVar1 == 0xffffffff) {
        plVar2 = (long *)0x0;
      }
      bVar3 = (char)uVar1 != '\0';
    }
    std::vector<bool,_std::allocator<bool>_>::push_back(&this->fileUsage,bVar3);
    if ((ulong)plVar2[2] < (ulong)plVar2[3]) {
      plVar2[2] = plVar2[2] + 1;
    }
    else {
      (**(code **)(*plVar2 + 0x50))(plVar2);
    }
  }
  std::istream::seekg((long)file,_S_beg);
  local_49 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_48,
             (ulong)(this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
             ((long)(this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
             (long)(this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,&local_49,
             &local_4a);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)this);
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  *(ulong *)&(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._12_4_,
                local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_finish.super__Bit_iterator_base._M_offset);
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p =
       local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  *(ulong *)&(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset =
       CONCAT44(local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._12_4_,
                local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_offset);
  return;
}

Assistant:

RegionChecker::RegionChecker(std::istream &file) {
	file.seekg(0, file.beg);
	std::istreambuf_iterator<char> iter(file);
	while (iter != std::istreambuf_iterator<char>()) {
		fileUsage.push_back(*iter != 0);
		iter++;
	}
	file.seekg(0, file.beg);
	usedBits = std::vector<bool>(fileUsage.size());
}